

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,char **args,char **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Printer *this_00;
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_168;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11b;
  undefined1 local_11a;
  allocator local_119;
  string local_118;
  allocator local_e1;
  string local_e0;
  string *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  iterator local_58;
  size_type local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char **args_local_1;
  char **args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_11a = 1;
  local_c0 = &local_b8;
  pcVar1 = *args;
  local_30 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = args;
  args_local = (char **)format;
  format_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,pcVar1,&local_e1);
  ToString(&local_b8,&local_e0);
  pcVar1 = *(char **)args_local_2;
  local_c0 = &local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,pcVar1,&local_119);
  ToString(&local_98,&local_118);
  local_c0 = &local_78;
  ToString(local_c0,local_30);
  local_11a = 0;
  local_58 = &local_b8;
  local_50 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_11b);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,&local_11b);
  io::Printer::FormatInternal(this_00,&local_48,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_11b);
  local_168 = (string *)&local_58;
  do {
    local_168 = local_168 + -1;
    std::__cxx11::string::~string((string *)local_168);
  } while (local_168 != &local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }